

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::RemoveProperty(Element *this,String *name)

{
  ElementMeta *pEVar1;
  PropertyId PVar2;
  ShorthandId id;
  bool bVar3;
  PropertyIdSetIterator local_50;
  undefined1 local_40 [8];
  PropertyIdSetIterator it;
  PropertyIdSet property_id_set;
  ShorthandId shorthand_id;
  PropertyId property_id;
  String *name_local;
  Element *this_local;
  
  PVar2 = StyleSheetSpecification::GetPropertyId(name);
  if (PVar2 == Invalid) {
    id = StyleSheetSpecification::GetShorthandId(name);
    if (id != Invalid) {
      join_0x00000010_0x00000000_ =
           (_WordT  [2])StyleSheetSpecification::GetShorthandUnderlyingProperties(id);
      _local_40 = PropertyIdSet::begin((PropertyIdSet *)&it.id_index);
      while( true ) {
        local_50 = PropertyIdSet::end((PropertyIdSet *)&it.id_index);
        bVar3 = PropertyIdSetIterator::operator!=((PropertyIdSetIterator *)local_40,&local_50);
        if (!bVar3) break;
        pEVar1 = this->meta;
        PVar2 = PropertyIdSetIterator::operator*((PropertyIdSetIterator *)local_40);
        ElementStyle::RemoveProperty(&pEVar1->style,PVar2);
        PropertyIdSetIterator::operator++((PropertyIdSetIterator *)local_40);
      }
    }
  }
  else {
    ElementStyle::RemoveProperty(&this->meta->style,PVar2);
  }
  return;
}

Assistant:

void Element::RemoveProperty(const String& name)
{
	auto property_id = StyleSheetSpecification::GetPropertyId(name);
	if (property_id != PropertyId::Invalid)
		meta->style.RemoveProperty(property_id);
	else
	{
		auto shorthand_id = StyleSheetSpecification::GetShorthandId(name);
		if (shorthand_id != ShorthandId::Invalid)
		{
			auto property_id_set = StyleSheetSpecification::GetShorthandUnderlyingProperties(shorthand_id);
			for (auto it = property_id_set.begin(); it != property_id_set.end(); ++it)
				meta->style.RemoveProperty(*it);
		}
	}
}